

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O3

void __thiscall CCIT<TTA>::FirstScan(CCIT<TTA> *this)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  Mat1i *pMVar6;
  Mat1b *pMVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  bool bVar44;
  ulong local_90;
  long local_70;
  long local_68;
  long local_60;
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar18 = 0;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  puVar12 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar15 = TTA::tail_;
  puVar13 = TTA::next_;
  TTA::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar4 = *(int *)&pMVar6->field_0xc;
  lVar39 = (long)iVar4;
  uVar5 = *(uint *)&pMVar6->field_0x8;
  uVar26 = (ulong)uVar5;
  if (0 < lVar39) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar8 = *(long *)&pMVar7->field_0x10;
    lVar30 = **(long **)&pMVar7->field_0x48 + lVar8;
    lVar9 = *(long *)&pMVar6->field_0x10;
    do {
      lVar41 = (long)iVar18;
      if (*(char *)(lVar8 + lVar41) == '\0') {
        lVar10 = lVar41 + 1;
        iVar20 = (int)lVar10;
        if ((iVar20 < iVar4) && (*(char *)(lVar8 + lVar10) != '\0')) {
LAB_001de491:
          uVar33 = (ulong)TTA::length_;
          puVar12[uVar33] = TTA::length_;
          puVar13[uVar33] = 0xffffffff;
          uVar33 = (ulong)TTA::length_;
          puVar15[uVar33] = TTA::length_;
          uVar31 = TTA::length_ + 1;
          *(uint *)(lVar9 + lVar41 * 4) = TTA::length_;
          TTA::length_ = uVar31;
          goto LAB_001de4b9;
        }
        if (1 < (int)uVar5) {
          if (*(char *)(lVar30 + lVar41) == '\0') {
            if ((iVar20 < iVar4) && (*(char *)(lVar30 + lVar10) != '\0')) goto LAB_001de491;
          }
          else {
            uVar33 = (ulong)TTA::length_;
            puVar12[uVar33] = TTA::length_;
            puVar13[uVar33] = 0xffffffff;
            uVar33 = (ulong)TTA::length_;
            puVar15[uVar33] = TTA::length_;
            uVar31 = TTA::length_ + 1;
            *(uint *)(lVar9 + lVar41 * 4) = TTA::length_;
            TTA::length_ = uVar31;
            if (iVar20 < iVar4) {
              cVar3 = *(char *)(lVar30 + lVar10);
              goto joined_r0x001de5e4;
            }
          }
        }
LAB_001de602:
        uVar42 = (ulong)(iVar18 + 2);
      }
      else {
        uVar33 = (ulong)TTA::length_;
        puVar12[uVar33] = TTA::length_;
        puVar13[uVar33] = 0xffffffff;
        uVar33 = (ulong)TTA::length_;
        puVar15[uVar33] = TTA::length_;
        uVar31 = TTA::length_ + 1;
        *(uint *)(lVar9 + lVar41 * 4) = TTA::length_;
        TTA::length_ = uVar31;
        lVar41 = lVar41 + 1;
        if (iVar4 <= (int)lVar41) goto LAB_001de602;
        if (*(char *)(lVar8 + lVar41) == '\0') {
          if (1 < (int)uVar5) {
            cVar3 = *(char *)(lVar30 + lVar41);
joined_r0x001de5e4:
            if (cVar3 != '\0') goto LAB_001de4b9;
          }
          goto LAB_001de602;
        }
LAB_001de4b9:
        puVar16 = TTA::tail_;
        puVar14 = TTA::next_;
        uVar31 = iVar18 + 2;
        uVar42 = (ulong)uVar31;
        if ((int)uVar31 < iVar4) {
          uVar42 = (ulong)(int)uVar31;
          iVar18 = iVar18 + 3;
          do {
            if (*(char *)(lVar8 + uVar42) == '\0') {
              if ((iVar18 < iVar4) && (*(char *)(lVar8 + iVar18) != '\0')) {
                if (((int)uVar5 < 2) || (*(char *)(lVar30 + uVar42) == '\0')) {
LAB_001de568:
                  uVar33 = (ulong)TTA::length_;
                  puVar12[uVar33] = TTA::length_;
                  puVar14[uVar33] = 0xffffffff;
                  uVar33 = (ulong)TTA::length_;
                  puVar16[uVar33] = TTA::length_;
                  TTA::length_ = TTA::length_ + 1;
                }
                *(int *)(lVar9 + uVar42 * 4) = (int)uVar33;
                goto LAB_001de58f;
              }
              if (1 < (int)uVar5) {
                if (*(char *)(lVar30 + uVar42) == '\0') {
                  if ((iVar18 < iVar4) && (*(char *)(lVar30 + iVar18) != '\0')) goto LAB_001de568;
                }
                else {
                  *(int *)(lVar9 + uVar42 * 4) = (int)uVar33;
                  if (iVar18 < iVar4) goto LAB_001de546;
                }
              }
LAB_001de5ec:
              uVar42 = uVar42 + 2;
              break;
            }
            *(int *)(lVar9 + uVar42 * 4) = (int)uVar33;
            if (iVar4 <= iVar18) goto LAB_001de5ec;
            if (*(char *)(lVar8 + iVar18) == '\0') {
              if (1 < (int)uVar5) {
LAB_001de546:
                if (*(char *)(lVar30 + iVar18) != '\0') goto LAB_001de58f;
              }
              goto LAB_001de5ec;
            }
LAB_001de58f:
            uVar42 = uVar42 + 2;
            iVar18 = iVar18 + 2;
          } while ((long)uVar42 < lVar39);
        }
      }
      iVar18 = (int)uVar42;
    } while (iVar18 < iVar4);
  }
  if (2 < (int)uVar5) {
    local_90 = 2;
    local_60 = 1;
    local_68 = 3;
    local_70 = 0;
    do {
      if (0 < iVar4) {
        pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar30 = *(long *)&pMVar7->field_0x10;
        lVar41 = **(long **)&pMVar7->field_0x48;
        lVar27 = lVar41 * local_90 + lVar30;
        lVar34 = lVar27 - lVar41;
        lVar28 = lVar27 + lVar41;
        lVar10 = *(long *)&pMVar6->field_0x10;
        lVar11 = **(long **)&pMVar6->field_0x48;
        lVar35 = lVar11 * local_90 + lVar10;
        lVar36 = lVar35 + lVar11 * -2;
        lVar8 = lVar34 + -1;
        lVar37 = lVar36 + -8;
        uVar33 = local_90 | 1;
        lVar9 = lVar34 + 1;
        uVar31 = 0;
        do {
          uVar21 = (ulong)(int)uVar31;
          uVar42 = uVar21 + 1;
          iVar18 = (int)uVar42;
          if (*(char *)(lVar27 + uVar21) == '\0') {
            if ((iVar18 < iVar4) && (*(char *)(lVar27 + uVar42) != '\0')) {
              if (*(char *)(lVar34 + uVar42) == '\0') {
                if (*(char *)(lVar34 + uVar21) != '\0') {
                  uVar32 = *(uint *)(lVar36 + uVar21 * 4);
                  *(uint *)(lVar35 + uVar21 * 4) = uVar32;
                  goto LAB_001de999;
                }
LAB_001de9c7:
                if (((int)(uVar21 + 2) < iVar4) && (*(char *)(lVar34 + uVar21 + 2) != '\0')) {
                  uVar29 = (ulong)*(uint *)(lVar36 + 8 + uVar21 * 4);
                }
                else {
LAB_001de9e2:
                  uVar42 = (ulong)TTA::length_;
                  TTA::rtable_[uVar42] = TTA::length_;
                  TTA::next_[uVar42] = 0xffffffff;
                  uVar29 = (ulong)TTA::length_;
                  TTA::tail_[uVar29] = TTA::length_;
                  TTA::length_ = TTA::length_ + 1;
                }
              }
              else {
                uVar29 = (ulong)*(uint *)(lVar36 + uVar21 * 4);
              }
              *(int *)(lVar35 + uVar21 * 4) = (int)uVar29;
              bVar44 = true;
              goto LAB_001dea2c;
            }
            if (uVar33 < uVar26) {
              if (*(char *)(lVar28 + uVar21) == '\0') {
                if ((iVar18 < iVar4) && (*(char *)(lVar28 + uVar42) != '\0')) goto LAB_001de9e2;
              }
              else {
                uVar29 = (ulong)TTA::length_;
                TTA::rtable_[uVar29] = TTA::length_;
                TTA::next_[uVar29] = 0xffffffff;
                uVar29 = (ulong)TTA::length_;
                TTA::tail_[uVar29] = TTA::length_;
                uVar32 = TTA::length_ + 1;
                *(uint *)(lVar35 + uVar21 * 4) = TTA::length_;
                TTA::length_ = uVar32;
                if ((iVar18 < iVar4) && (bVar44 = true, *(char *)(lVar28 + uVar42) != '\0'))
                goto LAB_001dea2c;
              }
            }
LAB_001de950:
            uVar32 = uVar31 + 2;
          }
          else {
            if ((iVar18 < iVar4) && (*(char *)(lVar27 + uVar42) != '\0')) {
              if (*(char *)(lVar34 + uVar21) == '\0') {
                if (*(char *)(lVar34 + uVar42) == '\0') {
                  if (((int)uVar31 < 2) || (*(char *)(lVar8 + uVar21) == '\0')) goto LAB_001de9c7;
                  uVar32 = *(uint *)(lVar37 + uVar21 * 4);
                  *(uint *)(lVar35 + uVar21 * 4) = uVar32;
                  uVar21 = (ulong)uVar31;
LAB_001de999:
                  uVar29 = (ulong)uVar32;
                  goto LAB_001de9a0;
                }
                uVar32 = *(uint *)(lVar36 + uVar21 * 4);
                uVar29 = (ulong)uVar32;
                *(uint *)(lVar35 + uVar21 * 4) = uVar32;
                bVar44 = true;
                if (((int)uVar31 < 2) || (*(char *)(lVar8 + uVar21) == '\0')) goto LAB_001dea2c;
                uVar32 = *(uint *)(lVar37 + uVar21 * 4);
LAB_001de9b8:
                bVar44 = true;
                TTA::Merge((uint)uVar29,uVar32);
              }
              else {
                uVar32 = *(uint *)(lVar36 + uVar21 * 4);
                uVar29 = (ulong)uVar32;
                *(uint *)(lVar35 + uVar21 * 4) = uVar32;
                bVar44 = true;
                if (*(char *)(lVar34 + uVar42) == '\0') {
LAB_001de9a0:
                  bVar44 = true;
                  if (((int)(uVar21 + 2) < iVar4) && (*(char *)(lVar34 + uVar21 + 2) != '\0')) {
                    uVar32 = *(uint *)(lVar36 + 8 + uVar21 * 4);
                    goto LAB_001de9b8;
                  }
                }
              }
            }
            else {
              if (*(char *)(lVar34 + uVar21) == '\0') {
                if (((int)uVar31 < 2) || (*(char *)(lVar8 + uVar21) == '\0')) {
                  if ((iVar18 < iVar4) && (*(char *)(lVar34 + uVar42) != '\0')) goto LAB_001de77b;
                  uVar29 = (ulong)TTA::length_;
                  TTA::rtable_[uVar29] = TTA::length_;
                  TTA::next_[uVar29] = 0xffffffff;
                  uVar29 = (ulong)TTA::length_;
                  TTA::tail_[uVar29] = TTA::length_;
                  TTA::length_ = TTA::length_ + 1;
                  goto LAB_001de8d1;
                }
                uVar32 = *(uint *)(lVar37 + uVar21 * 4);
                uVar29 = (ulong)uVar32;
                *(uint *)(lVar35 + uVar21 * 4) = uVar32;
                if (iVar4 <= iVar18) goto LAB_001de950;
                if (*(char *)(lVar34 + (uVar42 & 0xffffffff)) != '\0') {
                  TTA::Merge(uVar32,*(uint *)(lVar36 + uVar21 * 4));
                }
              }
              else {
LAB_001de77b:
                uVar29 = (ulong)*(uint *)(lVar36 + uVar21 * 4);
LAB_001de8d1:
                *(int *)(lVar35 + uVar21 * 4) = (int)uVar29;
              }
              if ((iVar4 <= iVar18) || (uVar26 <= uVar33)) goto LAB_001de950;
              bVar44 = *(char *)(lVar28 + uVar42) != '\0';
            }
LAB_001dea2c:
            uVar32 = uVar31 + 2;
            if ((bVar44) && ((int)uVar32 < iVar4)) {
              lVar38 = (long)(int)uVar32;
              lVar1 = lVar35 + lVar38 * 4;
              lVar22 = lVar41 * local_60 + lVar30 + lVar38;
              lVar2 = lVar11 * local_70 + lVar10 + lVar38 * 4;
              lVar23 = lVar41 * local_68 + lVar30 + lVar38;
              lVar43 = 0;
              do {
                uVar42 = (ulong)uVar31 + 3 + lVar43;
                uVar40 = (uint)uVar29;
                iVar20 = (int)uVar42;
                iVar18 = (int)lVar43;
                if (*(char *)(lVar27 + lVar38 + lVar43) == '\0') {
                  if ((iVar4 <= iVar20) ||
                     (lVar24 = (long)iVar20, *(char *)(lVar27 + lVar24) == '\0')) {
                    if (uVar33 < uVar26) {
                      if (*(char *)(lVar23 + lVar43) != '\0') {
                        *(uint *)(lVar1 + lVar43 * 4) = uVar40;
                        if (iVar4 <= iVar20) goto LAB_001dee57;
                        goto LAB_001dec01;
                      }
                      if ((iVar20 < iVar4) && (*(char *)(lVar28 + iVar20) != '\0')) {
LAB_001dec92:
                        uVar42 = (ulong)TTA::length_;
                        TTA::rtable_[uVar42] = TTA::length_;
                        TTA::next_[uVar42] = 0xffffffff;
                        uVar29 = (ulong)TTA::length_;
                        TTA::tail_[uVar29] = TTA::length_;
                        TTA::length_ = TTA::length_ + 1;
                        goto LAB_001dece6;
                      }
                    }
                    goto LAB_001dee57;
                  }
                  if ((uVar33 < uVar26) && (*(char *)(lVar23 + lVar43) != '\0')) {
                    *(uint *)(lVar1 + lVar43 * 4) = uVar40;
                    if (*(char *)(lVar34 + lVar24) == '\0') {
                      if (*(char *)(lVar22 + lVar43) != '\0') {
                        iVar20 = uVar31 + iVar18 + 4;
                        if ((iVar4 <= iVar20) || (*(char *)(lVar34 + iVar20) == '\0'))
                        goto LAB_001debb1;
                        uVar19 = TTA::Merge(*(uint *)(lVar2 + lVar43 * 4),
                                            *(uint *)(lVar36 + (long)iVar20 * 4));
                        goto LAB_001debba;
                      }
                    }
                    else {
LAB_001debb1:
                      uVar19 = *(uint *)(lVar2 + lVar43 * 4);
LAB_001debba:
                      TTA::Merge(uVar40,uVar19);
                    }
LAB_001dee02:
                    iVar18 = uVar31 + iVar18 + 4;
                    if ((iVar18 < iVar4) &&
                       (uVar21 = (ulong)iVar18, *(char *)(lVar34 + uVar21) != '\0'))
                    goto LAB_001dee20;
                  }
                  else {
                    if (*(char *)(lVar34 + lVar24) == '\0') {
                      if (*(char *)(lVar22 + lVar43) != '\0') {
                        uVar40 = *(uint *)(lVar2 + lVar43 * 4);
                        uVar29 = (ulong)uVar40;
                        *(uint *)(lVar1 + lVar43 * 4) = uVar40;
                        goto LAB_001dee02;
                      }
                      iVar18 = uVar31 + iVar18 + 4;
                      if ((iVar4 <= iVar18) || (*(char *)(lVar34 + iVar18) == '\0'))
                      goto LAB_001dec92;
                      uVar29 = (ulong)*(uint *)(lVar36 + (long)iVar18 * 4);
                    }
                    else {
                      uVar29 = (ulong)*(uint *)(lVar2 + lVar43 * 4);
                    }
LAB_001dece6:
                    *(int *)(lVar1 + lVar43 * 4) = (int)uVar29;
                  }
                }
                else {
                  uVar21 = (ulong)uVar31 + lVar43;
                  *(uint *)(lVar1 + lVar43 * 4) = uVar40;
                  iVar17 = (int)uVar21;
                  if ((iVar4 <= iVar20) || (*(char *)(lVar27 + iVar20) == '\0')) {
                    if (*(char *)(lVar22 + lVar43) == '\0') {
                      if ((-1 < iVar17) &&
                         (uVar21 = uVar21 & 0xffffffff, *(char *)(lVar9 + uVar21) != '\0')) {
                        if ((iVar20 < iVar4) && (*(char *)(lVar34 + (uVar42 & 0xffffffff)) != '\0'))
                        {
                          uVar19 = TTA::Merge(*(uint *)(lVar36 + uVar21 * 4),
                                              *(uint *)(lVar2 + lVar43 * 4));
                        }
                        else {
                          uVar19 = *(uint *)(lVar36 + uVar21 * 4);
                        }
                        goto LAB_001deb3c;
                      }
                      if (iVar4 <= iVar20) goto LAB_001dee57;
                      if (*(char *)(lVar34 + iVar20) != '\0') goto LAB_001deb33;
                    }
                    else {
LAB_001deb33:
                      uVar19 = *(uint *)(lVar2 + lVar43 * 4);
LAB_001deb3c:
                      TTA::Merge(uVar40,uVar19);
                    }
                    if ((iVar20 < iVar4) && (uVar33 < uVar26)) {
LAB_001dec01:
                      if (*(char *)(lVar28 + iVar20) != '\0') goto LAB_001ded3c;
                    }
LAB_001dee57:
                    uVar32 = uVar32 + iVar18 + 2;
                    goto LAB_001dee63;
                  }
                  cVar3 = *(char *)(lVar34 + iVar20);
                  if (*(char *)(lVar22 + lVar43) == '\0') {
                    if (cVar3 != '\0') {
                      if ((iVar17 < 0) || (*(char *)(lVar9 + (uVar21 & 0xffffffff)) == '\0'))
                      goto LAB_001ded26;
                      uVar19 = *(uint *)(lVar36 + (uVar21 & 0xffffffff) * 4);
                      uVar25 = *(uint *)(lVar2 + lVar43 * 4);
                      goto LAB_001ded1a;
                    }
                    if ((iVar17 < 0) ||
                       (uVar21 = uVar21 & 0xffffffff, *(char *)(lVar9 + uVar21) == '\0'))
                    goto LAB_001dee02;
                    uVar25 = uVar31 + iVar18 + 4;
                    if (((int)uVar25 < iVar4) && (*(char *)(lVar34 + (ulong)uVar25) != '\0')) {
                      uVar19 = *(uint *)(lVar36 + uVar21 * 4);
                      uVar25 = *(uint *)(lVar36 + (ulong)uVar25 * 4);
                      goto LAB_001ded1a;
                    }
LAB_001dee20:
                    uVar19 = *(uint *)(lVar36 + uVar21 * 4);
LAB_001ded2f:
                    uVar40 = (uint)uVar29;
                  }
                  else {
                    if (((cVar3 != '\0') || (iVar18 = uVar31 + iVar18 + 4, iVar4 <= iVar18)) ||
                       (*(char *)(lVar34 + iVar18) == '\0')) {
LAB_001ded26:
                      uVar19 = *(uint *)(lVar2 + lVar43 * 4);
                      goto LAB_001ded2f;
                    }
                    uVar19 = *(uint *)(lVar2 + lVar43 * 4);
                    uVar25 = *(uint *)(lVar36 + (long)iVar18 * 4);
LAB_001ded1a:
                    uVar19 = TTA::Merge(uVar19,uVar25);
                  }
                  TTA::Merge(uVar40,uVar19);
                }
LAB_001ded3c:
                lVar24 = lVar38 + lVar43;
                lVar43 = lVar43 + 2;
              } while (lVar24 + 2 < lVar39);
              uVar32 = uVar32 + (int)lVar43;
            }
          }
LAB_001dee63:
          uVar31 = uVar32;
        } while ((int)uVar31 < iVar4);
      }
      local_90 = local_90 + 2;
      local_60 = local_60 + 2;
      local_70 = local_70 + 2;
      local_68 = local_68 + 2;
    } while ((int)local_90 < (int)uVar5);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w = img_labels_.cols;
        int h = img_labels_.rows;

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }